

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

kvtree * kvtree_set_kv(kvtree *hash,char *key,char *val)

{
  kvtree *pkVar1;
  undefined8 local_38;
  kvtree *v;
  kvtree *k;
  char *val_local;
  char *key_local;
  kvtree *hash_local;
  
  if (hash == (kvtree *)0x0) {
    hash_local = (kvtree *)0x0;
  }
  else {
    v = kvtree_get(hash,key);
    if (v == (kvtree *)0x0) {
      pkVar1 = kvtree_new();
      v = kvtree_set(hash,key,pkVar1);
    }
    local_38 = kvtree_get(v,val);
    if (local_38 == (kvtree *)0x0) {
      pkVar1 = kvtree_new();
      local_38 = kvtree_set(v,val,pkVar1);
    }
    hash_local = local_38;
  }
  return hash_local;
}

Assistant:

kvtree* kvtree_set_kv(kvtree* hash, const char* key, const char* val)
{
  if (hash == NULL) {
    return NULL;
  }

  kvtree* k = kvtree_get(hash, key);
  if (k == NULL) {
    k = kvtree_set(hash, key, kvtree_new());
  }

  kvtree* v = kvtree_get(k, val);
  if (v == NULL) {
    v = kvtree_set(k, val, kvtree_new());
  }

  return v;
}